

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O0

void __thiscall
glcts::ArraysOfArrays::InteractionUniforms2<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (InteractionUniforms2<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  bool bVar1;
  pointer ppVar2;
  TestError *pTVar3;
  string *local_2d8;
  string **local_238;
  string *fs;
  string *gs;
  string *tes;
  string *tcs;
  string *vs;
  string *cs;
  string shader_source;
  int local_1c4;
  undefined1 local_1c0 [4];
  int sub_script_entry_index;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  uint local_140;
  int local_13c;
  int permutation_index;
  int initialiser_selector;
  string base_variable_string;
  _Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_> local_110;
  iterator local_108;
  _Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_> local_100;
  _supported_variable_types_map_const_iterator var_iterator;
  size_t var_type_index;
  size_t num_var_types;
  test_var_type *var_types_set;
  allocator<char> local_d8;
  allocator<char> local_d7;
  allocator<char> local_d6;
  allocator<char> local_d5 [20];
  allocator<char> local_c1;
  string *local_c0;
  string local_b8 [8];
  string array_initializers [5];
  TestShaderType tested_shader_type_local;
  InteractionUniforms2<glcts::ArraysOfArrays::Interface::GL> *this_local;
  
  local_c0 = local_b8;
  array_initializers[4].field_2._12_4_ = tested_shader_type;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_b8,
             "int[2][2][2][2](\n    int[2][2][2](\n        int[2][2](\n            int[2]( 1,  2),\n            int[2]( 3,  4)\n        ),\n        int[2][2](\n            int[2]( 5,  6),\n            int[2]( 7,  8)\n        )\n    ),\n    int[2][2][2](\n        int[2][2](\n            int[2](11, 12),\n            int[2](13, 14)\n        ),\n        int[2][2](\n            int[2](15, 16),\n            int[2](17, 18)\n        )\n    )\n)"
             ,&local_c1);
  local_c0 = (string *)(array_initializers[0].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(array_initializers[0].field_2._M_local_buf + 8),
             "float[2][2][2][2](\n    float[2][2][2](\n        float[2][2](\n            float[2](1.0, 2.0),\n            float[2](3.0, 4.0)),\n        float[2][2](\n            float[2](5.0, 6.0),\n            float[2](7.0, 8.0))),\n    float[2][2][2](\n        float[2][2](\n            float[2](1.1, 2.1),\n            float[2](3.1, 4.1)\n        ),\n        float[2][2](\n            float[2](5.1, 6.1),\n            float[2](7.1, 8.1)\n        )\n    )\n)"
             ,local_d5);
  local_c0 = (string *)(array_initializers[1].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(array_initializers[1].field_2._M_local_buf + 8),
             "mat4[2][2][2][2](\n    mat4[2][2][2](\n        mat4[2][2](\n            mat4[2]( mat4(1),  mat4(2)),\n            mat4[2]( mat4(3),  mat4(4))\n        ),\n        mat4[2][2](\n            mat4[2](mat4(5),  mat4(6)),\n            mat4[2](mat4(7),  mat4(8))\n        )\n    ),\n    mat4[2][2][2](\n        mat4[2][2](\n            mat4[2](mat4(9),  mat4(10)),\n            mat4[2](mat4(11),  mat4(12))\n        ),\n        mat4[2][2](\n            mat4[2](mat4(13),  mat4(14)),\n            mat4[2](mat4(15),  mat4(16))\n        )\n    )\n)"
             ,&local_d6);
  local_c0 = (string *)(array_initializers[2].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(array_initializers[2].field_2._M_local_buf + 8),
             "double[2][2][2][2](\n    double[2][2][2](\n        double[2][2](\n            double[2](1.0, 2.0),\n            double[2](3.0, 4.0)),\n        double[2][2](\n            double[2](5.0, 6.0),\n            double[2](7.0, 8.0))),\n    double[2][2][2](\n        double[2][2](\n            double[2](1.1, 2.1),\n            double[2](3.1, 4.1)\n        ),\n        double[2][2](\n            double[2](5.1, 6.1),\n            double[2](7.1, 8.1)\n        )\n    )\n)"
             ,&local_d7);
  local_c0 = (string *)(array_initializers[3].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(array_initializers[3].field_2._M_local_buf + 8),
             "dmat4[2][2][2][2](\n    dmat4[2][2][2](\n        dmat4[2][2](\n            dmat4[2]( dmat4(1),  dmat4(2)),\n            dmat4[2]( dmat4(3),  dmat4(4))\n        ),\n        dmat4[2][2](\n            dmat4[2](dmat4(5),  dmat4(6)),\n            dmat4[2](dmat4(7),  dmat4(8))\n        )\n    ),\n    dmat4[2][2][2](\n        dmat4[2][2](\n            dmat4[2](dmat4(9),   dmat4(10)),\n            dmat4[2](dmat4(11),  dmat4(12))\n        ),\n        dmat4[2][2](\n            dmat4[2](dmat4(13),  dmat4(14)),\n            dmat4[2](dmat4(15),  dmat4(16))\n        )\n    )\n)"
             ,&local_d8);
  std::allocator<char>::~allocator(&local_d8);
  std::allocator<char>::~allocator(&local_d7);
  std::allocator<char>::~allocator(&local_d6);
  std::allocator<char>::~allocator(local_d5);
  std::allocator<char>::~allocator(&local_c1);
  var_iterator._M_node = (_Base_ptr)0x0;
  while( true ) {
    if ((_Base_ptr)&DAT_00000004 < var_iterator._M_node) {
      local_2d8 = (string *)(array_initializers[4].field_2._M_local_buf + 8);
      do {
        local_2d8 = local_2d8 + -0x20;
        std::__cxx11::string::~string(local_2d8);
      } while (local_2d8 != local_b8);
      return;
    }
    local_108._M_node =
         (_Base_ptr)
         std::
         map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
         ::find((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                 *)supported_variable_types_map,
                test_shader_compilation::var_types_set_gl + (long)var_iterator._M_node);
    std::_Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>::
    _Rb_tree_const_iterator(&local_100,&local_108);
    base_variable_string.field_2._8_8_ =
         std::
         map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
         ::end((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                *)supported_variable_types_map);
    std::_Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>::
    _Rb_tree_const_iterator(&local_110,(iterator *)((long)&base_variable_string.field_2 + 8));
    bVar1 = std::operator!=(&local_100,&local_110);
    if (!bVar1) break;
    std::__cxx11::string::string((string *)&permutation_index);
    for (local_13c = 1; -1 < local_13c; local_13c = local_13c + -1) {
      for (local_140 = 0xe; -1 < (int)local_140; local_140 = local_140 - 1) {
        ppVar2 = std::
                 _Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>
                 ::operator->(&local_100);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1c0,"uniform ",&(ppVar2->second).precision);
        std::operator+(&local_1a0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1c0," ");
        ppVar2 = std::
                 _Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>
                 ::operator->(&local_100);
        std::operator+(&local_180,&local_1a0,&(ppVar2->second).type);
        std::operator+(&local_160,&local_180," x");
        std::__cxx11::string::operator=((string *)&permutation_index,(string *)&local_160);
        std::__cxx11::string::~string((string *)&local_160);
        std::__cxx11::string::~string((string *)&local_180);
        std::__cxx11::string::~string((string *)&local_1a0);
        std::__cxx11::string::~string((string *)local_1c0);
        for (local_1c4 = 3; -1 < local_1c4; local_1c4 = local_1c4 + -1) {
          if ((local_140 & 1 << ((byte)local_1c4 & 0x1f)) == 0) {
            std::__cxx11::string::operator+=((string *)&permutation_index,"[]");
          }
          else {
            std::__cxx11::string::operator+=((string *)&permutation_index,"[2]");
          }
        }
        if (local_13c == 0) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&shader_source.field_2 + 8)," = ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&array_initializers
                                 [(long)((long)&var_iterator._M_node[-1]._M_right + 7)].field_2 + 8)
                        );
          std::__cxx11::string::operator+=
                    ((string *)&permutation_index,(string *)(shader_source.field_2._M_local_buf + 8)
                    );
          std::__cxx11::string::~string((string *)(shader_source.field_2._M_local_buf + 8));
        }
        std::__cxx11::string::operator+=((string *)&permutation_index,";\n\n");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cs,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &permutation_index,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       shader_start_abi_cxx11_);
        switch(array_initializers[4].field_2._12_4_) {
        case 0:
          break;
        case 1:
          std::__cxx11::string::operator+=((string *)&cs,"\n\tgl_Position = vec4(0.0);\n");
          break;
        case 2:
          break;
        case 3:
          std::__cxx11::string::operator+=((string *)&cs,(string *)emit_quad_abi_cxx11_);
          break;
        case 4:
          std::__cxx11::string::operator+=((string *)&cs,(string *)set_tesseation_abi_cxx11_);
          break;
        case 5:
          break;
        default:
          pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar3,"Unrecognized shader type.",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                     ,0x1aa1);
          __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        std::__cxx11::string::operator+=((string *)&cs,(string *)shader_end_abi_cxx11_);
        if ((local_13c == 0) || (local_140 == 7)) {
          vs = (string *)empty_string_abi_cxx11_;
          tcs = (string *)default_vertex_shader_source_abi_cxx11_;
          tes = (string *)default_tc_shader_source_abi_cxx11_;
          gs = (string *)default_te_shader_source_abi_cxx11_;
          fs = (string *)default_geometry_shader_source_abi_cxx11_;
          local_238 = (string **)default_fragment_shader_source_abi_cxx11_;
          switch(array_initializers[4].field_2._12_4_) {
          case 0:
            local_238 = &cs;
            break;
          case 1:
            tcs = (string *)&cs;
            break;
          case 2:
            vs = (string *)&cs;
            tcs = (string *)empty_string_abi_cxx11_;
            tes = (string *)empty_string_abi_cxx11_;
            gs = (string *)empty_string_abi_cxx11_;
            fs = (string *)empty_string_abi_cxx11_;
            local_238 = (string **)empty_string_abi_cxx11_;
            break;
          case 3:
            fs = (string *)&cs;
            break;
          case 4:
            tes = (string *)&cs;
            break;
          case 5:
            gs = (string *)&cs;
            break;
          default:
            pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar3,"Invalid enum",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                       ,0x1aae);
            __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
          }
          (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.
            super_TestNode._vptr_TestNode[10])(this,tcs,tes,gs,fs,local_238,vs,1,0);
        }
        else {
          (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.
            super_TestNode._vptr_TestNode[8])
                    (this,(ulong)(uint)array_initializers[4].field_2._12_4_,&cs);
        }
        std::__cxx11::string::~string((string *)&cs);
      }
    }
    std::__cxx11::string::~string((string *)&permutation_index);
    var_iterator._M_node = (_Base_ptr)((long)&(var_iterator._M_node)->_M_color + 1);
  }
  pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar3,"Type not found.",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
             ,0x1ab4);
  __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void InteractionUniforms2<API>::test_shader_compilation(typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	static const glcts::test_var_type var_types_set_es[] = { VAR_TYPE_INT, VAR_TYPE_FLOAT, VAR_TYPE_MAT4 };
	static const size_t				  num_var_types_es   = sizeof(var_types_set_es) / sizeof(var_types_set_es[0]);

	static const glcts::test_var_type var_types_set_gl[] = { VAR_TYPE_INT, VAR_TYPE_FLOAT, VAR_TYPE_MAT4,
															 VAR_TYPE_DOUBLE, VAR_TYPE_DMAT4 };
	static const size_t num_var_types_gl = sizeof(var_types_set_gl) / sizeof(var_types_set_gl[0]);

	const std::string array_initializers[] = { "int[2][2][2][2](\n"
											   "    int[2][2][2](\n"
											   "        int[2][2](\n"
											   "            int[2]( 1,  2),\n"
											   "            int[2]( 3,  4)\n"
											   "        ),\n"
											   "        int[2][2](\n"
											   "            int[2]( 5,  6),\n"
											   "            int[2]( 7,  8)\n"
											   "        )\n"
											   "    ),\n"
											   "    int[2][2][2](\n"
											   "        int[2][2](\n"
											   "            int[2](11, 12),\n"
											   "            int[2](13, 14)\n"
											   "        ),\n"
											   "        int[2][2](\n"
											   "            int[2](15, 16),\n"
											   "            int[2](17, 18)\n"
											   "        )\n"
											   "    )\n"
											   ")",

											   "float[2][2][2][2](\n"
											   "    float[2][2][2](\n"
											   "        float[2][2](\n"
											   "            float[2](1.0, 2.0),\n"
											   "            float[2](3.0, 4.0)),\n"
											   "        float[2][2](\n"
											   "            float[2](5.0, 6.0),\n"
											   "            float[2](7.0, 8.0))),\n"
											   "    float[2][2][2](\n"
											   "        float[2][2](\n"
											   "            float[2](1.1, 2.1),\n"
											   "            float[2](3.1, 4.1)\n"
											   "        ),\n"
											   "        float[2][2](\n"
											   "            float[2](5.1, 6.1),\n"
											   "            float[2](7.1, 8.1)\n"
											   "        )\n"
											   "    )\n"
											   ")",

											   "mat4[2][2][2][2](\n"
											   "    mat4[2][2][2](\n"
											   "        mat4[2][2](\n"
											   "            mat4[2]( mat4(1),  mat4(2)),\n"
											   "            mat4[2]( mat4(3),  mat4(4))\n"
											   "        ),\n"
											   "        mat4[2][2](\n"
											   "            mat4[2](mat4(5),  mat4(6)),\n"
											   "            mat4[2](mat4(7),  mat4(8))\n"
											   "        )\n"
											   "    ),\n"
											   "    mat4[2][2][2](\n"
											   "        mat4[2][2](\n"
											   "            mat4[2](mat4(9),  mat4(10)),\n"
											   "            mat4[2](mat4(11),  mat4(12))\n"
											   "        ),\n"
											   "        mat4[2][2](\n"
											   "            mat4[2](mat4(13),  mat4(14)),\n"
											   "            mat4[2](mat4(15),  mat4(16))\n"
											   "        )\n"
											   "    )\n"
											   ")",

											   "double[2][2][2][2](\n"
											   "    double[2][2][2](\n"
											   "        double[2][2](\n"
											   "            double[2](1.0, 2.0),\n"
											   "            double[2](3.0, 4.0)),\n"
											   "        double[2][2](\n"
											   "            double[2](5.0, 6.0),\n"
											   "            double[2](7.0, 8.0))),\n"
											   "    double[2][2][2](\n"
											   "        double[2][2](\n"
											   "            double[2](1.1, 2.1),\n"
											   "            double[2](3.1, 4.1)\n"
											   "        ),\n"
											   "        double[2][2](\n"
											   "            double[2](5.1, 6.1),\n"
											   "            double[2](7.1, 8.1)\n"
											   "        )\n"
											   "    )\n"
											   ")",

											   "dmat4[2][2][2][2](\n"
											   "    dmat4[2][2][2](\n"
											   "        dmat4[2][2](\n"
											   "            dmat4[2]( dmat4(1),  dmat4(2)),\n"
											   "            dmat4[2]( dmat4(3),  dmat4(4))\n"
											   "        ),\n"
											   "        dmat4[2][2](\n"
											   "            dmat4[2](dmat4(5),  dmat4(6)),\n"
											   "            dmat4[2](dmat4(7),  dmat4(8))\n"
											   "        )\n"
											   "    ),\n"
											   "    dmat4[2][2][2](\n"
											   "        dmat4[2][2](\n"
											   "            dmat4[2](dmat4(9),   dmat4(10)),\n"
											   "            dmat4[2](dmat4(11),  dmat4(12))\n"
											   "        ),\n"
											   "        dmat4[2][2](\n"
											   "            dmat4[2](dmat4(13),  dmat4(14)),\n"
											   "            dmat4[2](dmat4(15),  dmat4(16))\n"
											   "        )\n"
											   "    )\n"
											   ")" };

	const glcts::test_var_type* var_types_set = var_types_set_es;
	size_t						num_var_types = num_var_types_es;

	if (API::USE_DOUBLE)
	{
		var_types_set = var_types_set_gl;
		num_var_types = num_var_types_gl;
	}

	for (size_t var_type_index = 0; var_type_index < num_var_types; var_type_index++)
	{
		_supported_variable_types_map_const_iterator var_iterator =
			supported_variable_types_map.find(var_types_set[var_type_index]);

		if (var_iterator != supported_variable_types_map.end())
		{
			std::string base_variable_string;

			for (int initialiser_selector = 1; initialiser_selector >= 0; initialiser_selector--)
			{
				// We normally do all 16 possible permutations of [4][4][4][4] items (15..0).
				// However, in this case we will skip the case that will work,
				// so we'll merely process permutations 14..0
				for (int permutation_index = 14; permutation_index >= 0; permutation_index--)
				{
					base_variable_string =
						"uniform " + var_iterator->second.precision + " " + var_iterator->second.type + " x";

					// for all 4 possible sub_script entries
					for (int sub_script_entry_index = 3; sub_script_entry_index >= 0; sub_script_entry_index--)
					{
						if (permutation_index & (1 << sub_script_entry_index))
						{
							// In this case, we'll use a valid sub_script
							base_variable_string += "[2]";
						}
						else
						{
							// In this case, we'll use an invalid sub_script
							base_variable_string += "[]";
						}
					}

					if (initialiser_selector == 0)
					{
						// We'll use an initialiser
						base_variable_string += " = " + array_initializers[var_type_index];
					}

					base_variable_string += ";\n\n";

					std::string shader_source = base_variable_string + shader_start;

					/* End main */
					DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

					/* Execute test:
					 *
					 * This will succeed in case of allowed unsized
					 * declarations and when at least one of these is
					 * true:
					 *   1. There is an initialiser.
					 *   2. Only the outermost dimension is unsized,
					 *      as in [][2][2][2].
					 */
					EXECUTE_SHADER_TEST(API::ALLOW_UNSIZED_DECLARATION &&
											(initialiser_selector == 0 || permutation_index == 7),
										tested_shader_type, shader_source);
				} /* for (int permutation_index = 14; ...) */
			}	 /* for (int initialiser_selector  = 1; ...) */
		}		  /* if var_type iterator found */
		else
		{
			TCU_FAIL("Type not found.");
		}
	} /* for (int var_type_index = 0; ...) */
}